

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example8.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  Scene *this;
  GeometricObject *this_00;
  Texture *m;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Vector local_88;
  Vector local_68;
  Vector local_48;
  
  this = (Scene *)operator_new(0xe8);
  this->_vptr_Scene = (_func_int **)&PTR__Scene_00108b48;
  (this->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->light).
  super__Vector_base<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solid).
  super__Vector_base<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->eye).x = 0.0;
  (this->eye).y = 0.0;
  (this->eye).z = 0.0;
  (this->eye_dir).x = 0.0;
  (this->eye_dir).y = 0.0;
  (this->eye_dir).z = 1.0;
  (this->view_x).x = 1.0;
  (this->view_x).y = 0.0;
  (this->view_x).z = 0.0;
  (this->view_y).x = 0.0;
  (this->view_y).y = 1.0;
  (this->view_y).z = 0.0;
  this->aperture = 0.0;
  this->focus = 0.0;
  (this->ambient).x = 1.0;
  (this->ambient).y = 1.0;
  (this->ambient).z = 1.0;
  (this->background).x = 0.0;
  (this->background).y = 0.05;
  (this->background).z = 0.05;
  this_00 = (GeometricObject *)operator_new(200);
  GeometricObject::GeometricObject(this_00);
  this_00->_vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108bc8;
  this_00[1]._vptr_GeometricObject = (_func_int **)0x0;
  this_00[1].def_material.ka = 0.0;
  this_00[1].def_material.kd = 0.0;
  this_00[1].def_material.ks = 4.0;
  this_00[1].def_material.kr = 16.0;
  (this_00->def_material).ka = 0.3;
  (this_00->def_material).kd = 0.2;
  (this_00->def_material).ks = 0.7;
  (this_00->def_material).kr = 0.0;
  (this_00->def_material).p = 0x1e;
  dVar1 = Grayzer::Medium::glass.beta;
  (this_00->def_material).med.ior = Grayzer::Medium::glass.ior;
  (this_00->def_material).med.beta = dVar1;
  (this_00->def_material).color.x = 1.0;
  (this_00->def_material).color.y = 0.0;
  (this_00->def_material).color.z = 0.0;
  m = (Texture *)operator_new(0x60);
  m->next = (Texture *)0x0;
  m->object = (GeometricObject *)0x0;
  m->turb = 0.0;
  m->octaves = 6;
  (m->offs).x = 0.0;
  (m->offs).y = 0.0;
  (m->offs).z = 0.0;
  (m->scale).x = 1.0;
  (m->scale).y = 1.0;
  m->_vptr_Texture = (_func_int **)&PTR__Texture_00108c60;
  (m->scale).z = 1.0;
  m[1]._vptr_Texture = (_func_int **)0x401c000000000000;
  GeometricObject::add(this_00,m);
  puVar2 = (undefined8 *)operator_new(0x40);
  puVar2[1] = 0x3ff0000000000000;
  puVar2[2] = 0x3ff0000000000000;
  *puVar2 = &PTR__LightSource_00108c10;
  puVar2[3] = 0x3ff0000000000000;
  puVar2[4] = 0xc024000000000000;
  puVar2[5] = 0x4020000000000000;
  puVar2[6] = 0xc034000000000000;
  puVar2[7] = 0x4034000000000000;
  puVar3 = (undefined8 *)operator_new(0x40);
  puVar3[1] = 0x3ff0000000000000;
  puVar3[2] = 0x3ff0000000000000;
  *puVar3 = &PTR__LightSource_00108c10;
  puVar3[3] = 0x3ff0000000000000;
  puVar3[4] = 0x4024000000000000;
  puVar3[5] = 0x4020000000000000;
  puVar3[6] = 0xc034000000000000;
  puVar3[7] = 0x4034000000000000;
  local_88.x = (double)this_00;
  std::vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>::
  emplace_back<GeometricObject*&>
            ((vector<std::shared_ptr<GeometricObject>,std::allocator<std::shared_ptr<GeometricObject>>>
              *)&this->solid,(GeometricObject **)&local_88);
  local_88.x = (double)puVar2;
  std::vector<std::shared_ptr<LightSource>,std::allocator<std::shared_ptr<LightSource>>>::
  emplace_back<LightSource*&>
            ((vector<std::shared_ptr<LightSource>,std::allocator<std::shared_ptr<LightSource>>> *)
             &this->light,(LightSource **)&local_88);
  local_88.x = (double)puVar3;
  std::vector<std::shared_ptr<LightSource>,std::allocator<std::shared_ptr<LightSource>>>::
  emplace_back<LightSource*&>
            ((vector<std::shared_ptr<LightSource>,std::allocator<std::shared_ptr<LightSource>>> *)
             &this->light,(LightSource **)&local_88);
  (this->background).x = 0.196078;
  (this->background).y = 0.6;
  (this->background).z = 0.8;
  init_noise();
  local_88.x = 0.0;
  local_88.y = 0.0;
  local_88.z = -7.0;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 1.0;
  local_68.x._0_4_ = 0;
  local_68.x._4_4_ = 0;
  local_68.y._0_4_ = 0;
  local_68.y._4_4_ = 0x3ff00000;
  local_68.z = 0.0;
  Scene::setCamera(this,&local_88,&local_48,&local_68);
  render_scene(this,1.5,1.0,300,200,"SAMPLE80.TGA");
  done_noise();
  return 0;
}

Assistant:

int main()
{
    Sphere* Sphere1;
    LightSource *Light1,*Light2;

    Scene* scene = new Scene;
    Sphere1 = new Sphere(Vector(0,0,0),4);

    Sphere1->ambient(0.3);
    Sphere1->diffuse(0.2);
    Sphere1->specular(0.7);
    Sphere1->reflection(0.0);
    Sphere1->ior(0.0);
    Sphere1->phong_size(30);
    Sphere1->medium(Grayzer::Medium::glass);
    Sphere1->color(Red);
    Sphere1->add(new Bumps(7.0));

    Light1 = new PointLight(Vector(-10,8,-20),20);
    Light2 = new PointLight(Vector(10,8,-20),20);

    scene->add(Sphere1);
    scene->add(Light1);
    scene->add(Light2);

    scene->setBackground(SkyBlue);

    init_noise();
    scene->setCamera(Vector(0,0,-7),Vector(0,0,1),Vector(0,1,0));
    render_scene(scene, 1.5,1.0,300,200,"SAMPLE80.TGA");
    done_noise();
}